

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O1

void soplex::SPxEquiliSC<double>::computePostequiExpVecs
               (SPxLPBase<double> *lp,vector<double,_std::allocator<double>_> *preRowscale,
               vector<double,_std::allocator<double>_> *preColscale,DataArray<int> *rowscaleExp,
               DataArray<int> *colscaleExp,double epsilon)

{
  DataArray<int> *scaleExp;
  double dVar1;
  double dVar2;
  
  dVar1 = maxPrescaledRatio<double>(lp,preRowscale,false);
  dVar2 = maxPrescaledRatio<double>(lp,preColscale,true);
  if (dVar2 <= dVar1) {
    computeEquiExpVec((SVSetBase<double> *)lp,preColscale,rowscaleExp,epsilon);
    lp = (SPxLPBase<double> *)&lp->super_LPColSetBase<double>;
    scaleExp = colscaleExp;
    colscaleExp = rowscaleExp;
  }
  else {
    computeEquiExpVec(&(lp->super_LPColSetBase<double>).super_SVSetBase<double>,preRowscale,
                      colscaleExp,epsilon);
    scaleExp = rowscaleExp;
  }
  computeEquiExpVec((SVSetBase<double> *)lp,colscaleExp,scaleExp,epsilon);
  return;
}

Assistant:

void SPxEquiliSC<R>::computePostequiExpVecs(const SPxLPBase<R>& lp,
      const std::vector<R>& preRowscale, const std::vector<R>& preColscale,
      DataArray<int>& rowscaleExp, DataArray<int>& colscaleExp, R epsilon)
{
   const R colratio = maxPrescaledRatio(lp, preRowscale, false);
   const R rowratio = maxPrescaledRatio(lp, preColscale, true);

   const bool colFirst = colratio < rowratio;

   // see SPxEquiliSC<R>::scale for reason behind this branch
   if(colFirst)
   {
      computeEquiExpVec(lp.colSet(), preRowscale, colscaleExp, epsilon);
      computeEquiExpVec(lp.rowSet(), colscaleExp, rowscaleExp, epsilon);
   }
   else
   {
      computeEquiExpVec(lp.rowSet(), preColscale, rowscaleExp, epsilon);
      computeEquiExpVec(lp.colSet(), rowscaleExp, colscaleExp, epsilon);
   }
}